

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O0

value_t __thiscall
rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>::filtration
          (rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>
           *this,index_t index)

{
  index_t idx;
  size_t sVar1;
  reference pvVar2;
  float *pfVar3;
  index_t in_ESI;
  compressed_distance_matrix<(compressed_matrix_layout)0> *in_RDI;
  index_t j;
  index_t i;
  value_t filtr;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff98;
  index_t in_stack_ffffffffffffffa8;
  value_type i_00;
  index_t dim;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out;
  value_t local_2c;
  int local_28;
  int local_24;
  int *local_20;
  int *local_18;
  float local_10 [4];
  
  local_10[0] = 0.0;
  dim = *(index_t *)
         &(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&(in_RDI->distances).super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
          super__Vector_impl_data._M_finish;
  sVar1 = compressed_distance_matrix<(compressed_matrix_layout)0>::size
                    ((compressed_distance_matrix<(compressed_matrix_layout)0> *)0x167587);
  idx = (index_t)sVar1;
  out._M_current =
       (int *)(in_RDI->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_18 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff98);
  local_20 = (int *)get_simplex_vertices<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              (idx,dim,in_ESI,(binomial_coeff_table *)in_RDI,out);
  for (local_24 = 0;
      local_24 <=
      *(int *)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)&(in_RDI->distances).super__Vector_base<float,_std::allocator<float>_>)->_M_impl
               ).super__Vector_impl_data._M_finish; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)&(in_RDI->distances).
                                 super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
                           super__Vector_impl_data._M_end_of_storage,(long)local_24);
      i_00 = *pvVar2;
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)
                 &(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)&(in_RDI->distances).super__Vector_base<float,_std::allocator<float>_>)->
                  _M_impl).super__Vector_impl_data._M_end_of_storage,(long)local_28);
      local_2c = compressed_distance_matrix<(compressed_matrix_layout)0>::operator()
                           (in_RDI,i_00,in_stack_ffffffffffffffa8);
      pfVar3 = std::max<float>(local_10,&local_2c);
      local_10[0] = *pfVar3;
    }
  }
  return local_10[0];
}

Assistant:

value_t filtration(const index_t index) const {
		value_t filtr = 0;
		get_simplex_vertices(index, dim, index_t(dist.size()), binomial_coeff, vertices.begin());

		for (index_t i = 0; i <= dim; ++i)
			for (index_t j = 0; j < i; ++j) { filtr = std::max(filtr, dist(vertices[i], vertices[j])); }
		return filtr;
	}